

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O3

int32_t ucnv_extMatchToU(int32_t *cx,int8_t sisoState,char *pre,int32_t preLength,char *src,
                        int32_t srcLength,uint32_t *pMatchValue,UBool param_8,UBool flush)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  char local_45;
  ulong uVar12;
  
  iVar4 = 0;
  if ((cx != (int32_t *)0x0) && (0 < cx[2])) {
    if (sisoState == '\0') {
      if (1 < preLength) {
        return 0;
      }
      iVar5 = 1;
      if (srcLength < 1) {
        iVar5 = srcLength;
      }
      srcLength = 0;
      if (preLength != 1) {
        srcLength = iVar5;
      }
      local_45 = '\x01';
    }
    else {
      local_45 = param_8;
    }
    iVar20 = 0;
    iVar7 = 0;
    uVar14 = 0;
    uVar19 = 0;
    iVar4 = 0;
    do {
      uVar18 = *(uint *)((long)cx + (ulong)uVar14 * 4 + (long)cx[1]);
      uVar8 = uVar18 & 0xffffff;
      uVar17 = uVar19;
      iVar6 = iVar4;
      if (uVar8 != 0) {
        iVar13 = iVar7 + iVar20;
        uVar17 = uVar8;
        iVar6 = iVar13;
        if ((-1 < sisoState) &&
           (uVar17 = uVar19, iVar6 = iVar4, (iVar13 != 1) != (sisoState == '\0'))) {
          uVar17 = uVar8;
          iVar6 = iVar13;
        }
      }
      uVar19 = uVar17;
      iVar4 = iVar6;
      if (iVar20 < preLength) {
        pcVar15 = pre;
        iVar13 = iVar7;
        iVar3 = iVar20 + 1;
        iVar9 = iVar20;
      }
      else {
        if (srcLength <= iVar7) {
          if ((local_45 == '\0') && (iVar7 + iVar20 < 0x20)) {
            return -(iVar7 + iVar20);
          }
          goto LAB_00323e77;
        }
        pcVar15 = src;
        iVar13 = iVar7 + 1;
        iVar3 = iVar20;
        iVar9 = iVar7;
      }
      iVar20 = iVar3;
      iVar7 = iVar13;
      lVar2 = (ulong)uVar14 * 4 + (long)cx[1];
      puVar16 = (uint *)((long)cx + lVar2 + 4);
      bVar1 = pcVar15[iVar9];
      uVar14 = *puVar16 >> 0x18;
      if (bVar1 < uVar14) goto LAB_00323e77;
      uVar10 = uVar18 >> 0x18;
      uVar12 = (ulong)uVar10;
      uVar8 = (uint)*(byte *)((long)cx + uVar12 * 4 + lVar2 + 3);
      if (uVar8 < bVar1) goto LAB_00323e77;
      if ((uVar8 - uVar14) + 1 == uVar10) {
        uVar14 = puVar16[(ulong)bVar1 - (ulong)uVar14];
      }
      else {
        uVar14 = 0;
        if (0x1ffffff < uVar18) {
          uVar8 = (uint)bVar1 * 0x1000000;
          uVar18 = 0;
          do {
            uVar14 = uVar18;
            if ((uint)uVar12 < 5) {
              if (((puVar16[(int)uVar18] < uVar8) &&
                  ((uVar14 = uVar18 + 1, (int)uVar10 <= (int)uVar14 ||
                   (puVar16[(int)uVar14] < uVar8)))) &&
                 ((uVar14 = uVar18 + 2, (int)uVar10 <= (int)uVar14 || (puVar16[(int)uVar14] < uVar8)
                  ))) {
                uVar14 = uVar18 + 3;
              }
              break;
            }
            uVar11 = (int)(uVar10 + uVar18) / 2;
            uVar18 = uVar11;
            if (puVar16[(int)uVar11] <= uVar8 + 0xffffff) {
              uVar18 = uVar10;
              uVar14 = uVar11;
            }
            uVar10 = uVar18;
            uVar12 = (ulong)(uVar10 - uVar14);
            uVar18 = uVar14;
          } while (1 < (int)(uVar10 - uVar14));
        }
        if (((int)uVar10 <= (int)uVar14) ||
           (uVar14 = puVar16[(int)uVar14], uVar14 >> 0x18 != (uint)bVar1)) goto LAB_00323e77;
      }
      uVar14 = uVar14 & 0xffffff;
      if (uVar14 == 0) goto LAB_00323e77;
    } while (uVar14 < 0x1f0000);
    iVar7 = iVar7 + iVar20;
    uVar19 = uVar14;
    iVar4 = iVar7;
    if ((-1 < sisoState) && (uVar19 = uVar17, iVar4 = iVar6, (iVar7 != 1) != (sisoState == '\0'))) {
      uVar19 = uVar14;
      iVar4 = iVar7;
    }
LAB_00323e77:
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      *pMatchValue = uVar19 & 0xff7fffff;
    }
  }
  return iVar4;
}

Assistant:

static int32_t
ucnv_extMatchToU(const int32_t *cx, int8_t sisoState,
                 const char *pre, int32_t preLength,
                 const char *src, int32_t srcLength,
                 uint32_t *pMatchValue,
                 UBool /*useFallback*/, UBool flush) {
    const uint32_t *toUTable, *toUSection;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    uint8_t b;

    if(cx==NULL || cx[UCNV_EXT_TO_U_LENGTH]<=0) {
        return 0; /* no extension data, no match */
    }

    /* initialize */
    toUTable=UCNV_EXT_ARRAY(cx, UCNV_EXT_TO_U_INDEX, uint32_t);
    idx=0;

    matchValue=0;
    i=j=matchLength=0;

    if(sisoState==0) {
        /* SBCS state of an SI/SO stateful converter, look at only exactly 1 byte */
        if(preLength>1) {
            return 0; /* no match of a DBCS sequence in SBCS mode */
        } else if(preLength==1) {
            srcLength=0;
        } else /* preLength==0 */ {
            if(srcLength>1) {
                srcLength=1;
            }
        }
        flush=TRUE;
    }

    /* we must not remember fallback matches when not using fallbacks */

    /* match input units until there is a full match or the input is consumed */
    for(;;) {
        /* go to the next section */
        toUSection=toUTable+idx;

        /* read first pair of the section */
        value=*toUSection++;
        length=UCNV_EXT_TO_U_GET_BYTE(value);
        value=UCNV_EXT_TO_U_GET_VALUE(value);
        if( value!=0 &&
            (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
             TO_U_USE_FALLBACK(useFallback)) &&
            UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
        ) {
            /* remember longest match so far */
            matchValue=value;
            matchLength=i+j;
        }

        /* match pre[] then src[] */
        if(i<preLength) {
            b=(uint8_t)pre[i++];
        } else if(j<srcLength) {
            b=(uint8_t)src[j++];
        } else {
            /* all input consumed, partial match */
            if(flush || (length=(i+j))>UCNV_EXT_MAX_BYTES) {
                /*
                 * end of the entire input stream, stop with the longest match so far
                 * or: partial match must not be longer than UCNV_EXT_MAX_BYTES
                 * because it must fit into state buffers
                 */
                break;
            } else {
                /* continue with more input next time */
                return -length;
            }
        }

        /* search for the current UChar */
        value=ucnv_extFindToU(toUSection, length, b);
        if(value==0) {
            /* no match here, stop with the longest match so far */
            break;
        } else {
            if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
                /* partial match, continue */
                idx=(int32_t)UCNV_EXT_TO_U_GET_PARTIAL_INDEX(value);
            } else {
                if( (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
                     TO_U_USE_FALLBACK(useFallback)) &&
                    UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
                ) {
                    /* full match, stop with result */
                    matchValue=value;
                    matchLength=i+j;
                } else {
                    /* full match on fallback not taken, stop with the longest match so far */
                }
                break;
            }
        }
    }

    if(matchLength==0) {
        /* no match at all */
        return 0;
    }

    /* return result */
    *pMatchValue=UCNV_EXT_TO_U_MASK_ROUNDTRIP(matchValue);
    return matchLength;
}